

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afmparse.c
# Opt level: O1

FT_Error afm_parser_parse(AFM_Parser parser)

{
  FT_Memory pFVar1;
  byte bVar2;
  int iVar3;
  AFM_Token AVar4;
  FT_Int FVar5;
  char *pcVar6;
  AFM_KernPair pAVar7;
  ulong uVar8;
  AFM_TrackKern pAVar9;
  FT_Int FVar10;
  bool bVar11;
  FT_Offset *in_RDX;
  FT_Offset *extraout_RDX;
  FT_Offset *extraout_RDX_00;
  FT_Offset *extraout_RDX_01;
  FT_Offset *extraout_RDX_02;
  FT_Offset *extraout_RDX_03;
  FT_Offset *extraout_RDX_04;
  FT_Offset *extraout_RDX_05;
  undefined8 extraout_RDX_06;
  FT_Offset *extraout_RDX_07;
  FT_Offset *extraout_RDX_08;
  FT_Offset *extraout_RDX_09;
  FT_Offset *extraout_RDX_10;
  FT_Offset *extraout_RDX_11;
  undefined8 extraout_RDX_12;
  FT_Offset *extraout_RDX_13;
  FT_Offset *extraout_RDX_14;
  FT_Offset *extraout_RDX_15;
  FT_Offset *extraout_RDX_16;
  FT_Offset *extraout_RDX_17;
  FT_Offset *extraout_RDX_18;
  FT_Offset *extraout_RDX_19;
  FT_Offset *extraout_RDX_20;
  FT_Offset *extraout_RDX_21;
  FT_Offset *extraout_RDX_22;
  int iVar13;
  AFM_FontInfo pAVar14;
  AFM_FontInfo pAVar15;
  AFM_ValueType_ AVar16;
  AFM_ValueType_ AVar17;
  FT_Error FVar18;
  FT_Offset len;
  FT_Offset len_1;
  AFM_ValueRec shared_vals [4];
  AFM_ValueType_ local_c8;
  AFM_ValueType_ local_c4;
  FT_Offset local_c0;
  AFM_FontInfo local_b8;
  FT_Offset local_b0;
  AFM_ValueRec_ local_a8;
  undefined4 local_98;
  FT_UInt local_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  FT_Int local_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  FT_Int local_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  FT_Fixed local_60;
  AFM_FontInfo local_50;
  ulong local_48;
  FT_Offset local_40;
  FT_Memory local_38;
  FT_Offset *pFVar12;
  
  pAVar14 = parser->FontInfo;
  if (pAVar14 == (AFM_FontInfo)0x0) {
    FVar18 = 6;
  }
  else {
    pFVar1 = parser->memory;
    pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_c0,in_RDX);
    FVar18 = 2;
    if (((pcVar6 != (char *)0x0) && (local_c0 == 0x10)) &&
       (iVar3 = strncmp(pcVar6,"StartFontMetrics",0x10), iVar3 == 0)) {
      local_48 = 0;
      pFVar12 = extraout_RDX;
      AVar16 = 0xa0;
      local_b8 = pAVar14;
      local_38 = pFVar1;
LAB_0014e52f:
      pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_c0,pFVar12);
      AVar17 = AVar16;
      if (pcVar6 != (char *)0x0) {
        AVar4 = afm_tokenize(pcVar6,local_c0);
        bVar2 = 1;
        pFVar12 = extraout_RDX_00;
        if (0x1d < (int)AVar4) {
          if ((int)AVar4 < 0x2d) {
            if (AVar4 == AFM_TOKEN_ISCIDFONT) {
              local_a8.type = AFM_VALUE_TYPE_BOOL;
              FVar5 = afm_parser_read_vals(parser,&local_a8,1);
              bVar2 = 5;
              pFVar12 = extraout_RDX_18;
              if (FVar5 != 1) goto LAB_0014ebcd;
              pAVar14->IsCIDFont = local_a8.u.b;
            }
            else if (AVar4 == AFM_TOKEN_METRICSSETS) {
              local_a8.type = AFM_VALUE_TYPE_INTEGER;
              FVar5 = afm_parser_read_vals(parser,&local_a8,1);
              if (FVar5 == 1) {
                local_48 = (ulong)local_a8.u.u;
              }
              bVar2 = 5;
              pFVar12 = extraout_RDX_02;
              if ((FVar5 != 1) ||
                 (AVar17 = AFM_VALUE_TYPE_BOOL|AFM_VALUE_TYPE_INTEGER, (local_48 & 0xfffffffd) != 0)
                 ) goto LAB_0014ebcd;
            }
            goto LAB_0014eade;
          }
          if (AVar4 != AFM_TOKEN_STARTCHARMETRICS) {
            if (AVar4 == AFM_TOKEN_STARTKERNDATA) {
LAB_0014e69b:
              do {
                pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_40,pFVar12);
                pFVar12 = extraout_RDX_04;
                if (pcVar6 == (char *)0x0) {
LAB_0014ebab:
                  AVar16 = 0xa0;
                  goto LAB_0014ebb1;
                }
                AVar4 = afm_tokenize(pcVar6,local_40);
                pFVar12 = extraout_RDX_05;
                if ((int)AVar4 < 0x35) {
                  if (AVar4 - AFM_TOKEN_STARTKERNPAIRS < 2) {
                    pAVar15 = parser->FontInfo;
                    local_a8.type = AFM_VALUE_TYPE_INTEGER;
                    FVar5 = afm_parser_read_vals(parser,&local_a8,1);
                    bVar11 = local_a8.u.i < 0 || FVar5 != 1;
                    pFVar12 = (FT_Offset *)CONCAT71((int7)((ulong)extraout_RDX_06 >> 8),bVar11);
                    if (bVar11) {
LAB_0014e903:
                      AVar16 = 0xa0;
                    }
                    else {
                      pAVar15->NumKernPair = local_a8.u.i;
                      local_c8 = AVar16;
                      if (local_a8.u.i != 0) {
                        pAVar7 = (AFM_KernPair)
                                 ft_mem_realloc(parser->memory,0x10,0,(ulong)local_a8.u.u,
                                                (void *)0x0,(FT_Error *)&local_a8);
                        pAVar15->KernPairs = pAVar7;
                        pFVar12 = extraout_RDX_07;
                        local_c8 = local_a8.type;
                        AVar16 = local_a8.type;
                        if (local_a8.type != AFM_VALUE_TYPE_STRING) goto LAB_0014e909;
                      }
                      iVar3 = -1;
                      local_50 = pAVar15;
                      do {
                        pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_b0,pFVar12);
                        pFVar12 = extraout_RDX_08;
                        if (pcVar6 == (char *)0x0) goto LAB_0014ea61;
                        AVar4 = afm_tokenize(pcVar6,local_b0);
                        iVar13 = 2;
                        uVar8 = (ulong)(AVar4 - AFM_TOKEN_ENDFONTMETRICS);
                        pFVar12 = extraout_RDX_09;
                        if (AVar4 - AFM_TOKEN_ENDFONTMETRICS < 0x38) {
                          if ((7UL >> (uVar8 & 0x3f) & 1) == 0) {
                            if ((0x34000UL >> (uVar8 & 0x3f) & 1) == 0) {
                              if (uVar8 == 0x37) goto LAB_0014e898;
                            }
                            else {
                              iVar3 = iVar3 + 1;
                              iVar13 = 2;
                              if (iVar3 < (int)pAVar15->NumKernPair) {
                                pAVar7 = pAVar15->KernPairs + iVar3;
                                local_a8.type = AFM_VALUE_TYPE_INDEX;
                                local_98 = 5;
                                local_88 = 3;
                                local_78 = 3;
                                FVar5 = afm_parser_read_vals(parser,&local_a8,4);
                                pFVar12 = extraout_RDX_10;
                                pAVar15 = local_50;
                                if (FVar5 < 3) {
                                  bVar11 = false;
                                }
                                else {
                                  pAVar7->index1 = local_a8.u.i;
                                  pAVar7->index2 = local_90;
                                  if (AVar4 == AFM_TOKEN_KPY) {
                                    pAVar7->x = 0;
                                    FVar10 = local_80;
                                  }
                                  else {
                                    pAVar7->x = local_80;
                                    FVar10 = 0;
                                    if (FVar5 == 4 && AVar4 == AFM_TOKEN_KP) {
                                      FVar10 = local_70;
                                    }
                                  }
                                  pAVar7->y = FVar10;
                                  bVar11 = true;
                                  iVar13 = 0;
                                }
                              }
                              else {
                                bVar11 = false;
                              }
                              if (bVar11) {
LAB_0014e898:
                                iVar13 = 0;
                              }
                            }
                          }
                          else {
                            pAVar15->NumKernPair = iVar3 + 1U;
                            qsort(pAVar15->KernPairs,(ulong)(iVar3 + 1U),0x10,afm_compare_kern_pairs
                                 );
                            local_c8 = AFM_VALUE_TYPE_STRING;
                            iVar13 = 1;
                            pFVar12 = extraout_RDX_11;
                          }
                        }
                      } while (iVar13 == 0);
                      pAVar14 = local_b8;
                      AVar16 = 0xa0;
                      if (iVar13 != 2) {
                        AVar16 = local_c8;
                      }
                    }
                    goto LAB_0014e909;
                  }
                  AVar16 = AFM_VALUE_TYPE_STRING;
                  if (1 < AVar4 - AFM_TOKEN_ENDFONTMETRICS) goto LAB_0014ebab;
                  goto LAB_0014ebb1;
                }
              } while (AVar4 == AFM_TOKEN_UNKNOWN);
              if (AVar4 != AFM_TOKEN_STARTTRACKKERN) goto LAB_0014ebab;
              pAVar15 = parser->FontInfo;
              local_a8.type = AFM_VALUE_TYPE_INTEGER;
              FVar5 = afm_parser_read_vals(parser,&local_a8,1);
              pFVar12 = (FT_Offset *)
                        CONCAT71((int7)((ulong)extraout_RDX_12 >> 8),local_a8.u.i < 0 || FVar5 != 1)
              ;
              if (local_a8.u.i < 0 || FVar5 != 1) goto LAB_0014e903;
              pAVar15->NumTrackKern = local_a8.u.i;
              AVar17 = AVar16;
              if (local_a8.u.i != 0) {
                pAVar9 = (AFM_TrackKern)
                         ft_mem_realloc(parser->memory,0x28,0,(ulong)local_a8.u.u,(void *)0x0,
                                        (FT_Error *)&local_a8);
                pAVar15->TrackKerns = pAVar9;
                pFVar12 = extraout_RDX_13;
                AVar16 = local_a8.type;
                AVar17 = local_a8.type;
                if (local_a8.type != AFM_VALUE_TYPE_STRING) goto LAB_0014e909;
              }
              iVar3 = -1;
              do {
                pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_b0,pFVar12);
                pFVar12 = extraout_RDX_14;
                if (pcVar6 == (char *)0x0) goto LAB_0014ea61;
                AVar4 = afm_tokenize(pcVar6,local_b0);
                iVar13 = 2;
                pFVar12 = extraout_RDX_15;
                if ((int)AVar4 < 0x38) {
                  if ((AVar4 - AFM_TOKEN_ENDFONTMETRICS < 2) || (AVar4 == AFM_TOKEN_ENDTRACKKERN)) {
                    pAVar15->NumTrackKern = iVar3 + 1;
                    AVar17 = AFM_VALUE_TYPE_STRING;
                    iVar13 = 1;
                  }
                }
                else if (AVar4 == AFM_TOKEN_UNKNOWN) {
                  iVar13 = 0;
                }
                else if ((AVar4 == AFM_TOKEN_TRACKKERN) &&
                        (iVar3 = iVar3 + 1, iVar3 < (int)pAVar15->NumTrackKern)) {
                  pAVar9 = pAVar15->TrackKerns;
                  local_a8.type = AFM_VALUE_TYPE_INTEGER;
                  local_98 = 2;
                  local_88 = 2;
                  local_78 = 2;
                  local_68 = 2;
                  FVar5 = afm_parser_read_vals(parser,&local_a8,5);
                  pFVar12 = extraout_RDX_16;
                  iVar13 = 2;
                  if (FVar5 == 5) {
                    pAVar9[iVar3].degree = local_a8.u.i;
                    pAVar9[iVar3].min_ptsize = CONCAT44(uStack_8c,local_90);
                    pAVar9[iVar3].min_kern = CONCAT44(uStack_7c,local_80);
                    pAVar9[iVar3].max_ptsize = CONCAT44(uStack_6c,local_70);
                    pAVar9[iVar3].max_kern = local_60;
                    iVar13 = 0;
                  }
                }
              } while (iVar13 == 0);
              pAVar14 = local_b8;
              AVar16 = 0xa0;
              if (iVar13 != 2) {
                AVar16 = AVar17;
              }
              goto LAB_0014e909;
            }
            goto LAB_0014eade;
          }
          local_a8.type = AFM_VALUE_TYPE_INTEGER;
          FVar5 = afm_parser_read_vals(parser,&local_a8,1);
          if (FVar5 == 1) {
            iVar3 = local_a8.u.i + 1;
            pFVar12 = extraout_RDX_19;
            do {
              iVar3 = iVar3 + -1;
              if (iVar3 < 1) goto LAB_0014eb56;
              bVar11 = false;
              pcVar6 = afm_parser_next_key(parser,'\0',pFVar12);
              pFVar12 = extraout_RDX_20;
            } while (pcVar6 != (char *)0x0);
LAB_0014eb2f:
            AVar17 = 0xa0;
            goto LAB_0014eb35;
          }
          bVar11 = false;
          bVar2 = 5;
          pFVar12 = extraout_RDX_19;
          goto LAB_0014eb8e;
        }
        if ((int)AVar4 < 0x14) {
          if (AVar4 == AFM_TOKEN_ASCENDER) {
            local_a8.type = AFM_VALUE_TYPE_FIXED;
            FVar5 = afm_parser_read_vals(parser,&local_a8,1);
            bVar2 = 5;
            pFVar12 = extraout_RDX_17;
            if (FVar5 != 1) goto LAB_0014ebcd;
            pAVar14->Ascender = CONCAT44(local_a8.u.f._4_4_,local_a8.u.i);
          }
          else if (AVar4 == AFM_TOKEN_DESCENDER) {
            local_a8.type = AFM_VALUE_TYPE_FIXED;
            FVar5 = afm_parser_read_vals(parser,&local_a8,1);
            bVar2 = 5;
            pFVar12 = extraout_RDX_01;
            if (FVar5 != 1) goto LAB_0014ebcd;
            pAVar14->Descender = CONCAT44(local_a8.u.f._4_4_,local_a8.u.i);
          }
          goto LAB_0014eade;
        }
        if (AVar4 != AFM_TOKEN_ENDFONTMETRICS) {
          if (AVar4 == AFM_TOKEN_FONTBBOX) {
            local_a8.type = AFM_VALUE_TYPE_FIXED;
            local_98 = 2;
            local_88 = 2;
            local_78 = 2;
            FVar5 = afm_parser_read_vals(parser,&local_a8,4);
            bVar2 = 5;
            pFVar12 = extraout_RDX_03;
            if (FVar5 != 4) goto LAB_0014ebcd;
            (pAVar14->FontBBox).xMin = CONCAT44(local_a8.u.f._4_4_,local_a8.u.i);
            (pAVar14->FontBBox).yMin = CONCAT44(uStack_8c,local_90);
            (pAVar14->FontBBox).xMax = CONCAT44(uStack_7c,local_80);
            (pAVar14->FontBBox).yMax = CONCAT44(uStack_6c,local_70);
          }
          goto LAB_0014eade;
        }
        local_c4 = AFM_VALUE_TYPE_STRING;
        goto LAB_0014ebcd;
      }
      goto LAB_0014ebda;
    }
  }
  return FVar18;
LAB_0014ea61:
  pAVar14 = local_b8;
  AVar16 = 0xa0;
LAB_0014e909:
  if (AVar16 != AFM_VALUE_TYPE_STRING) goto LAB_0014ebb1;
  goto LAB_0014e69b;
LAB_0014ebb1:
  if (AVar16 == AFM_VALUE_TYPE_STRING) {
    local_c4 = AFM_VALUE_TYPE_STRING;
    AVar17 = AFM_VALUE_TYPE_STRING;
    bVar2 = 1;
  }
  else {
    bVar2 = 5;
    AVar17 = AVar16;
  }
  goto LAB_0014ebcd;
  while( true ) {
    AVar4 = afm_tokenize(pcVar6,CONCAT44(local_a8._4_4_,local_a8.type));
    AVar17 = AFM_VALUE_TYPE_STRING;
    pFVar12 = extraout_RDX_22;
    if ((AVar4 == AFM_TOKEN_ENDFONTMETRICS) || (AVar4 == AFM_TOKEN_ENDCHARMETRICS)) break;
LAB_0014eb56:
    pcVar6 = afm_parser_next_key(parser,(FT_Bool)&local_a8,pFVar12);
    bVar11 = pcVar6 != (char *)0x0;
    pFVar12 = extraout_RDX_21;
    if (pcVar6 == (char *)0x0) goto LAB_0014eb2f;
  }
LAB_0014eb35:
  if (bVar11 == false) {
    local_c4 = AVar17;
  }
  bVar2 = bVar11 ^ 1;
  pAVar14 = local_b8;
LAB_0014eb8e:
  AVar16 = AVar17;
  if (bVar11 != false) {
LAB_0014eade:
    bVar2 = 0;
    AVar17 = AVar16;
  }
LAB_0014ebcd:
  AVar16 = AVar17;
  if (bVar2 != 0) {
    if (bVar2 != 5) {
      return local_c4;
    }
LAB_0014ebda:
    pFVar1 = local_38;
    ft_mem_free(local_38,pAVar14->TrackKerns);
    pAVar14->TrackKerns = (AFM_TrackKern)0x0;
    pAVar14->NumTrackKern = 0;
    ft_mem_free(pFVar1,pAVar14->KernPairs);
    pAVar14->KernPairs = (AFM_KernPair)0x0;
    pAVar14->NumKernPair = 0;
    pAVar14->IsCIDFont = '\0';
    return AVar17;
  }
  goto LAB_0014e52f;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  afm_parser_parse( AFM_Parser  parser )
  {
    FT_Memory     memory = parser->memory;
    AFM_FontInfo  fi     = parser->FontInfo;
    FT_Error      error  = FT_ERR( Syntax_Error );
    char*         key;
    FT_Offset     len;
    FT_Int        metrics_sets = 0;


    if ( !fi )
      return FT_THROW( Invalid_Argument );

    key = afm_parser_next_key( parser, 1, &len );
    if ( !key || len != 16                              ||
         ft_strncmp( key, "StartFontMetrics", 16 ) != 0 )
      return FT_THROW( Unknown_File_Format );

    while ( ( key = afm_parser_next_key( parser, 1, &len ) ) != 0 )
    {
      AFM_ValueRec  shared_vals[4];


      switch ( afm_tokenize( key, len ) )
      {
      case AFM_TOKEN_METRICSSETS:
        if ( afm_parser_read_int( parser, &metrics_sets ) )
          goto Fail;

        if ( metrics_sets != 0 && metrics_sets != 2 )
        {
          error = FT_THROW( Unimplemented_Feature );

          goto Fail;
        }
        break;

      case AFM_TOKEN_ISCIDFONT:
        shared_vals[0].type = AFM_VALUE_TYPE_BOOL;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->IsCIDFont = shared_vals[0].u.b;
        break;

      case AFM_TOKEN_FONTBBOX:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[1].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[2].type = AFM_VALUE_TYPE_FIXED;
        shared_vals[3].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 4 ) != 4 )
          goto Fail;

        fi->FontBBox.xMin = shared_vals[0].u.f;
        fi->FontBBox.yMin = shared_vals[1].u.f;
        fi->FontBBox.xMax = shared_vals[2].u.f;
        fi->FontBBox.yMax = shared_vals[3].u.f;
        break;

      case AFM_TOKEN_ASCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Ascender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_DESCENDER:
        shared_vals[0].type = AFM_VALUE_TYPE_FIXED;
        if ( afm_parser_read_vals( parser, shared_vals, 1 ) != 1 )
          goto Fail;

        fi->Descender = shared_vals[0].u.f;
        break;

      case AFM_TOKEN_STARTCHARMETRICS:
        {
          FT_Int  n = 0;


          if ( afm_parser_read_int( parser, &n ) )
            goto Fail;

          error = afm_parser_skip_section( parser, n,
                                           AFM_TOKEN_ENDCHARMETRICS );
          if ( error )
            return error;
        }
        break;

      case AFM_TOKEN_STARTKERNDATA:
        error = afm_parse_kern_data( parser );
        if ( error )
          goto Fail;
        /* fall through since we only support kern data */

      case AFM_TOKEN_ENDFONTMETRICS:
        return FT_Err_Ok;

      default:
        break;
      }
    }

  Fail:
    FT_FREE( fi->TrackKerns );
    fi->NumTrackKern = 0;

    FT_FREE( fi->KernPairs );
    fi->NumKernPair = 0;

    fi->IsCIDFont = 0;

    return error;
  }